

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnglite.c
# Opt level: O0

char * png_error_string(int error)

{
  int error_local;
  char *local_8;
  
  switch(error) {
  case 0:
    local_8 = "No error";
    break;
  case 1:
    local_8 = "PNG done";
    break;
  case -10:
    local_8 = 
    "Wrong combination of arguments passed to png_open. You must use either a read_function or supply a file pointer to use."
    ;
    break;
  case -9:
    local_8 = "The PNG is unsupported by pnglite, too bad for you!";
    break;
  case -8:
    local_8 = "Unknown filter method used in scanline.";
    break;
  case -7:
    local_8 = "zlib reported an error.";
    break;
  case -6:
    local_8 = "Could not allocate memory.";
    break;
  case -5:
    local_8 = "CRC or chunk length error.";
    break;
  case -4:
    local_8 = "Reached end of file.";
    break;
  case -3:
    local_8 = "Failure while reading file.";
    break;
  case -2:
    local_8 = "No PNG header found. Are you sure this is a PNG?";
    break;
  case -1:
    local_8 = "Unknown file error.";
    break;
  default:
    local_8 = "Unknown error.";
  }
  return local_8;
}

Assistant:

char* png_error_string(int error)
{
	switch(error)
	{
	case PNG_NO_ERROR:
		return "No error";
	case PNG_FILE_ERROR:
		return "Unknown file error.";
	case PNG_HEADER_ERROR:
		return "No PNG header found. Are you sure this is a PNG?";
	case PNG_IO_ERROR:
		return "Failure while reading file.";
	case PNG_EOF_ERROR:
		return "Reached end of file.";
	case PNG_CRC_ERROR:
		return "CRC or chunk length error.";
	case PNG_MEMORY_ERROR:
		return "Could not allocate memory.";
	case PNG_ZLIB_ERROR:
		return "zlib reported an error.";
	case PNG_UNKNOWN_FILTER:
		return "Unknown filter method used in scanline.";
	case PNG_DONE:
		return "PNG done";
	case PNG_NOT_SUPPORTED:
		return "The PNG is unsupported by pnglite, too bad for you!";
	case PNG_WRONG_ARGUMENTS:
		return "Wrong combination of arguments passed to png_open. You must use either a read_function or supply a file pointer to use.";
	default:
		return "Unknown error.";
	};
}